

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::addTitleAndProtection
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *title,string *strIf,
          string *strElse)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  type *local_b8;
  type *leave;
  type *enter;
  string local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_31;
  string *local_30;
  string *strElse_local;
  string *strIf_local;
  string *title_local;
  VulkanHppGenerator *this_local;
  string *str;
  
  local_31 = 0;
  local_30 = strElse;
  strElse_local = strIf;
  strIf_local = title;
  title_local = &this->m_api;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (strElse_local);
  if (!bVar1) {
    getProtectFromTitle(&local_98,this,strIf_local);
    generateProtection(&local_78,this,&local_98,true);
    std::__cxx11::string::~string((string *)&local_98);
    leave = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(&local_78);
    local_b8 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>(&local_78);
    std::operator+(&local_158,"\n",leave);
    std::operator+(&local_138,&local_158,"  //=== ");
    std::operator+(&local_118,&local_138,strIf_local);
    std::operator+(&local_f8,&local_118," ===\n");
    std::operator+(&local_d8,&local_f8,strElse_local);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (leave);
    if ((!bVar1) &&
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(local_30), !bVar1)) {
      std::operator+(&local_178,"#else \n",local_30);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,local_b8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::addTitleAndProtection( std::string const & title, std::string const & strIf, std::string const & strElse ) const
{
  std::string str;
  if ( !strIf.empty() )
  {
    const auto [enter, leave] = generateProtection( getProtectFromTitle( title ) );
    str                       = "\n" + enter + "  //=== " + title + " ===\n" + strIf;
    if ( !enter.empty() && !strElse.empty() )
    {
      str += "#else \n" + strElse;
    }
    str += leave;
  }
  return str;
}